

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall
cppcms::widgets::select_multiple::element::element(element *this,string *val,string *msg,bool sel)

{
  pointer pcVar1;
  undefined7 in_register_00000009;
  
  *(uint *)this = (int)CONCAT71(in_register_00000009,sel) * 5 | *(uint *)this & 0xfffffff8;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar1 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id,pcVar1,pcVar1 + val->_M_string_length);
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->str_option,pcVar1,pcVar1 + msg->_M_string_length);
  (this->tr_option).n_ = 0;
  (this->tr_option).c_id_ = (char_type *)0x0;
  (this->tr_option).c_context_ = (char_type *)0x0;
  (this->tr_option).c_plural_ = (char_type *)0x0;
  (this->tr_option).id_._M_dataplus._M_p = (pointer)&(this->tr_option).id_.field_2;
  (this->tr_option).id_._M_string_length = 0;
  (this->tr_option).id_.field_2._M_local_buf[0] = '\0';
  (this->tr_option).context_._M_dataplus._M_p = (pointer)&(this->tr_option).context_.field_2;
  (this->tr_option).context_._M_string_length = 0;
  (this->tr_option).context_.field_2._M_local_buf[0] = '\0';
  (this->tr_option).plural_._M_dataplus._M_p = (pointer)&(this->tr_option).plural_.field_2;
  (this->tr_option).plural_._M_string_length = 0;
  (this->tr_option).plural_.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

select_multiple::element::element(std::string const &val,std::string const &msg,bool sel) :
	selected(sel),
	need_translation(0),
	original_select(sel),
	id(val),
	str_option(msg)
{
}